

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::BufferStorage::ErrorsTest::iterate(ErrorsTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  GLchar *error_message;
  Enum<int,_2UL> EVar4;
  undefined1 local_138 [8];
  Buffer buffer_5;
  Buffer buffer_4;
  Buffer buffer_3;
  Buffer buffer_2;
  Buffer buffer_1;
  Buffer buffer;
  GetNameFunc local_98;
  int local_90;
  string local_88;
  allocator<char> local_51;
  string local_50 [8];
  string message;
  uint local_28;
  GLenum target;
  GLuint i;
  bool test_result;
  Functions *gl;
  ErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _i = (Functions *)CONCAT44(extraout_var,iVar1);
  target._3_1_ = 1;
  BufferStorage::Buffer::LoadExtDirectStateAccess((this->super_TestCase).m_context);
  if (m_direct_state_access_support == 0) {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_NOT_SUPPORTED,"Unsupported");
  }
  else {
    for (local_28 = 0; local_28 < 0xd; local_28 = local_28 + 1) {
      message.field_2._12_4_ =
           *(undefined4 *)(BufferStorage::Buffer::m_targets + (ulong)local_28 * 4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_50,"BufferStorage was executed for id 0, target: ",&local_51);
      std::allocator<char>::~allocator(&local_51);
      EVar4 = glu::getBufferTargetStr(message.field_2._12_4_);
      local_98 = EVar4.m_getName;
      local_90 = EVar4.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_98);
      std::__cxx11::string::c_str();
      std::__cxx11::string::append((char *)local_50);
      std::__cxx11::string::~string((string *)&local_88);
      BufferStorage::Buffer::Bind(_i,0,message.field_2._12_4_);
      (*_i->bufferStorage)(message.field_2._12_4_,0,(void *)0x0,0x100);
      error_message = (GLchar *)std::__cxx11::string::c_str();
      verifyError(this,0x502,error_message,(bool *)((long)&target + 3));
      std::__cxx11::string::~string(local_50);
    }
    BufferStorage::Buffer::Buffer((Buffer *)&buffer_1.m_target,(this->super_TestCase).m_context);
    BufferStorage::Buffer::InitStorage((Buffer *)&buffer_1.m_target,0x8892,0x100,0x20,iterate::data)
    ;
    if (_i->namedBufferStorage != (glNamedBufferStorageFunc)0x0) {
      (*_i->namedBufferStorage)(buffer_1.m_target,0x20,iterate::data,0x100);
      verifyError(this,0x502,"NamedBufferStorage was executed for id with immutable storage",
                  (bool *)((long)&target + 3));
    }
    BufferStorage::Buffer::Bind(_i,buffer_1.m_target,0x8892);
    (*_i->bufferStorage)(0x8892,0x20,iterate::data,0x100);
    verifyError(this,0x502,"BufferStorage was executed for target with immutable storage",
                (bool *)((long)&target + 3));
    BufferStorage::Buffer::Bind(_i,0,0x8892);
    BufferStorage::Buffer::~Buffer((Buffer *)&buffer_1.m_target);
    BufferStorage::Buffer::Buffer((Buffer *)&buffer_2.m_target,(this->super_TestCase).m_context);
    (*_i->createBuffers)(1,&buffer_2.m_target);
    if (_i->namedBufferStorage != (glNamedBufferStorageFunc)0x0) {
      (*_i->namedBufferStorage)(buffer_2.m_target,0,iterate()::data,0x100);
      verifyError(this,0x501,"NamedBufferStorage was executed with size == 0",
                  (bool *)((long)&target + 3));
      (*_i->namedBufferStorage)(buffer_2.m_target,-0x10,iterate()::data,0x100);
      verifyError(this,0x501,"NamedBufferStorage was executed with size == -16",
                  (bool *)((long)&target + 3));
    }
    BufferStorage::Buffer::Bind(_i,buffer_2.m_target,0x8892);
    (*_i->bufferStorage)(0x8892,0,iterate()::data,0x100);
    verifyError(this,0x501,"BufferStorage was executed with size == 0",(bool *)((long)&target + 3));
    (*_i->bufferStorage)(0x8892,-0x10,iterate()::data,0x100);
    verifyError(this,0x501,"BufferStorage was executed with size == -16",(bool *)((long)&target + 3)
               );
    BufferStorage::Buffer::Bind(_i,0,0x8892);
    BufferStorage::Buffer::~Buffer((Buffer *)&buffer_2.m_target);
    BufferStorage::Buffer::Buffer((Buffer *)&buffer_3.m_target,(this->super_TestCase).m_context);
    (*_i->createBuffers)(1,&buffer_3.m_target);
    if (_i->namedBufferStorage != (glNamedBufferStorageFunc)0x0) {
      (*_i->namedBufferStorage)(buffer_3.m_target,0x20,iterate()::data,0x40);
      verifyError(this,0x501,"NamedBufferStorage was executed with flags == GL_MAP_PERSISTENT_BIT",
                  (bool *)((long)&target + 3));
    }
    BufferStorage::Buffer::Bind(_i,buffer_3.m_target,0x8892);
    (*_i->bufferStorage)(0x8892,0x20,iterate()::data,0x40);
    verifyError(this,0x501,"BufferStorage was executed with flags == GL_MAP_PERSISTENT_BIT",
                (bool *)((long)&target + 3));
    BufferStorage::Buffer::Bind(_i,0,0x8892);
    BufferStorage::Buffer::~Buffer((Buffer *)&buffer_3.m_target);
    BufferStorage::Buffer::Buffer((Buffer *)&buffer_4.m_target,(this->super_TestCase).m_context);
    (*_i->createBuffers)(1,&buffer_4.m_target);
    if (_i->namedBufferStorage != (glNamedBufferStorageFunc)0x0) {
      (*_i->namedBufferStorage)(buffer_4.m_target,0x20,iterate()::data,0x80);
      verifyError(this,0x501,"NamedBufferStorage was executed with flags == GL_MAP_COHERENT_BIT",
                  (bool *)((long)&target + 3));
    }
    BufferStorage::Buffer::Bind(_i,buffer_4.m_target,0x8892);
    (*_i->bufferStorage)(0x8892,0x20,iterate()::data,0x80);
    verifyError(this,0x501,"BufferStorage was executed with flags == GL_MAP_COHERENT_BIT",
                (bool *)((long)&target + 3));
    BufferStorage::Buffer::Bind(_i,0,0x8892);
    BufferStorage::Buffer::~Buffer((Buffer *)&buffer_4.m_target);
    BufferStorage::Buffer::Buffer((Buffer *)&buffer_5.m_target,(this->super_TestCase).m_context);
    BufferStorage::Buffer::InitStorage
              ((Buffer *)&buffer_5.m_target,0x8892,0x100,0x20,iterate()::data);
    if (_i->mapNamedBufferRange != (glMapNamedBufferRangeFunc)0x0) {
      (*_i->mapNamedBufferRange)(buffer_5.m_target,0,0x20,1);
      verifyError(this,0x502,
                  "MapNamedBufferRange was executed with access == GL_MAP_READ_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                  ,(bool *)((long)&target + 3));
      (*_i->mapNamedBufferRange)(buffer_5.m_target,0,0x20,2);
      verifyError(this,0x502,
                  "MapNamedBufferRange was executed with access == GL_MAP_WRITE_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                  ,(bool *)((long)&target + 3));
      (*_i->mapNamedBufferRange)(buffer_5.m_target,0,0x20,0x40);
      verifyError(this,0x502,
                  "MapNamedBufferRange was executed with access == GL_MAP_PERSISTENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                  ,(bool *)((long)&target + 3));
      (*_i->mapNamedBufferRange)(buffer_5.m_target,0,0x20,0x80);
      verifyError(this,0x502,
                  "MapNamedBufferRange was executed with access == GL_MAP_COHERENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                  ,(bool *)((long)&target + 3));
    }
    BufferStorage::Buffer::Bind(_i,buffer_5.m_target,0x8892);
    (*_i->mapBufferRange)(0x8892,0,0x20,1);
    verifyError(this,0x502,
                "MapBufferRange was executed with access == GL_MAP_READ_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                ,(bool *)((long)&target + 3));
    (*_i->mapBufferRange)(0x8892,0,0x20,2);
    verifyError(this,0x502,
                "MapBufferRange was executed with access == GL_MAP_WRITE_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                ,(bool *)((long)&target + 3));
    (*_i->mapBufferRange)(0x8892,0,0x20,0x40);
    verifyError(this,0x502,
                "MapBufferRange was executed with access == GL_MAP_PERSISTENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                ,(bool *)((long)&target + 3));
    (*_i->mapBufferRange)(0x8892,0,0x20,0x80);
    verifyError(this,0x502,
                "MapBufferRange was executed with access == GL_MAP_COHERENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                ,(bool *)((long)&target + 3));
    BufferStorage::Buffer::Bind(_i,0,0x8892);
    BufferStorage::Buffer::~Buffer((Buffer *)&buffer_5.m_target);
    BufferStorage::Buffer::Buffer((Buffer *)local_138,(this->super_TestCase).m_context);
    BufferStorage::Buffer::InitStorage((Buffer *)local_138,0x8892,0x43,0x20,iterate()::data);
    if (_i->namedBufferSubData != (glNamedBufferSubDataFunc)0x0) {
      (*_i->namedBufferSubData)(local_138._0_4_,0,0x20,iterate()::data);
      verifyError(this,0x502,
                  "NamedBufferSubData was executed for storage without GL_DYNAMIC_STORAGE_BIT",
                  (bool *)((long)&target + 3));
    }
    BufferStorage::Buffer::Bind(_i,local_138._0_4_,0x8892);
    (*_i->bufferSubData)(0x8892,0,0x20,iterate()::data);
    verifyError(this,0x502,"BufferSubData was executed for storage without GL_DYNAMIC_STORAGE_BIT",
                (bool *)((long)&target + 3));
    BufferStorage::Buffer::Bind(_i,0,0x8892);
    BufferStorage::Buffer::~Buffer((Buffer *)local_138);
    if ((target._3_1_ & 1) == 1) {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_PASS,"Pass");
    }
    else {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      tcu::TestContext::setTestResult(pTVar3,QP_TEST_RESULT_FAIL,"Fail");
    }
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ErrorsTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	Buffer::LoadExtDirectStateAccess(m_context);

	// No GL45 or GL_ARB_direct_state_access support
	if (m_direct_state_access_support == FUNCTIONALITY_SUPPORT_NONE)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Unsupported");
		return tcu::TestNode::STOP;
	}

	/*
	 * - INVALID_OPERATION is generated by BufferStorage when 0 is bound to
	 * <target>; Check all targets;
	 */
	for (GLuint i = 0; i < Buffer::m_n_targets; ++i)
	{
		const GLenum target  = Buffer::m_targets[i];
		std::string  message = "BufferStorage was executed for id 0, target: ";

		message.append(glu::getBufferTargetStr(target).toString().c_str());

		Buffer::Bind(gl, 0 /* id */, target);
		gl.bufferStorage(target, 0 /* size */, 0 /* data */, GL_DYNAMIC_STORAGE_BIT /* flags */);

		verifyError(GL_INVALID_OPERATION, message.c_str(), test_result);
	}

	/*
	 * - INVLIAD_OPERATION is generated by BufferStorage, NamedBufferStorage and
	 * BufferData if buffer already have immutable store;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		buffer.InitStorage(GL_ARRAY_BUFFER, GL_DYNAMIC_STORAGE_BIT, data_size, data);

		/* NamedBufferStorage */
		if (0 != gl.namedBufferStorage)
		{
			gl.namedBufferStorage(buffer.m_id, data_size, data, GL_DYNAMIC_STORAGE_BIT);
			verifyError(GL_INVALID_OPERATION, "NamedBufferStorage was executed for id with immutable storage",
						test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferStorage(GL_ARRAY_BUFFER, data_size, data, GL_DYNAMIC_STORAGE_BIT);
		verifyError(GL_INVALID_OPERATION, "BufferStorage was executed for target with immutable storage", test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVALID_VALUE is generated by BufferStorage and NamedBufferStorage when
	 * <size> is less or equal to zero;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		gl.createBuffers(1, &buffer.m_id);

		/* NamedBufferStorage */
		if (0 != gl.namedBufferStorage)
		{
			gl.namedBufferStorage(buffer.m_id, 0 /* size */, data, GL_DYNAMIC_STORAGE_BIT);
			verifyError(GL_INVALID_VALUE, "NamedBufferStorage was executed with size == 0", test_result);

			gl.namedBufferStorage(buffer.m_id, -16 /* size */, data, GL_DYNAMIC_STORAGE_BIT);
			verifyError(GL_INVALID_VALUE, "NamedBufferStorage was executed with size == -16", test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferStorage(GL_ARRAY_BUFFER, 0 /* size */, data, GL_DYNAMIC_STORAGE_BIT);
		verifyError(GL_INVALID_VALUE, "BufferStorage was executed with size == 0", test_result);

		gl.bufferStorage(GL_ARRAY_BUFFER, -16 /* size */, data, GL_DYNAMIC_STORAGE_BIT);
		verifyError(GL_INVALID_VALUE, "BufferStorage was executed with size == -16", test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVLAID_VALUE is generated by BufferStorage and NamedBufferStorage when
	 * <flags> contains MAP_PERSISTENT_BIT and neither MAP_READ_BIT nor
	 * MAP_WRITE_BIT;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		gl.createBuffers(1, &buffer.m_id);

		/* NamedBufferStorage */
		if (0 != gl.namedBufferStorage)
		{
			gl.namedBufferStorage(buffer.m_id, data_size, data, GL_MAP_PERSISTENT_BIT);
			verifyError(GL_INVALID_VALUE, "NamedBufferStorage was executed with flags == GL_MAP_PERSISTENT_BIT",
						test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferStorage(GL_ARRAY_BUFFER, data_size, data, GL_MAP_PERSISTENT_BIT);
		verifyError(GL_INVALID_VALUE, "BufferStorage was executed with flags == GL_MAP_PERSISTENT_BIT", test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVALID_VALUE is generated by BufferStorage and NamedBufferStorage when
	 * <flags> contains MAP_COHERENT_BIT and no MAP_PERSISTENT_BIT;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		gl.createBuffers(1, &buffer.m_id);

		/* NamedBufferStorage */
		if (0 != gl.namedBufferStorage)
		{
			gl.namedBufferStorage(buffer.m_id, data_size, data, GL_MAP_COHERENT_BIT);
			verifyError(GL_INVALID_VALUE, "NamedBufferStorage was executed with flags == GL_MAP_COHERENT_BIT",
						test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferStorage(GL_ARRAY_BUFFER, data_size, data, GL_MAP_COHERENT_BIT);
		verifyError(GL_INVALID_VALUE, "BufferStorage was executed with flags == GL_MAP_COHERENT_BIT", test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVALID_OPERATION is generated by MapBufferRange if any of:
	 *   * MAP_COHERENT_BIT,
	 *   * MAP_PERSISTENT_BIT,
	 *   * MAP_READ_BIT,
	 *   * MAP_WRITE_BIT
	 * is included in <access> and not in buffer's storage flags;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		buffer.InitStorage(GL_ARRAY_BUFFER, GL_DYNAMIC_STORAGE_BIT, data_size, data);

		/* MapNamedBufferRange */
		if (0 != gl.mapNamedBufferRange)
		{
			gl.mapNamedBufferRange(buffer.m_id, 0 /* offset */, data_size, GL_MAP_READ_BIT);
			verifyError(GL_INVALID_OPERATION, "MapNamedBufferRange was executed with access == GL_MAP_READ_BIT, "
											  "storage flags == GL_DYNAMIC_STORAGE_BIT",
						test_result);

			gl.mapNamedBufferRange(buffer.m_id, 0 /* offset */, data_size, GL_MAP_WRITE_BIT);
			verifyError(GL_INVALID_OPERATION, "MapNamedBufferRange was executed with access == GL_MAP_WRITE_BIT, "
											  "storage flags == GL_DYNAMIC_STORAGE_BIT",
						test_result);

			gl.mapNamedBufferRange(buffer.m_id, 0 /* offset */, data_size, GL_MAP_PERSISTENT_BIT);
			verifyError(GL_INVALID_OPERATION, "MapNamedBufferRange was executed with access == GL_MAP_PERSISTENT_BIT, "
											  "storage flags == GL_DYNAMIC_STORAGE_BIT",
						test_result);

			gl.mapNamedBufferRange(buffer.m_id, 0 /* offset */, data_size, GL_MAP_COHERENT_BIT);
			verifyError(GL_INVALID_OPERATION, "MapNamedBufferRange was executed with access == GL_MAP_COHERENT_BIT, "
											  "storage flags == GL_DYNAMIC_STORAGE_BIT",
						test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.mapBufferRange(GL_ARRAY_BUFFER, 0 /* offset */, data_size, GL_MAP_READ_BIT);
		verifyError(
			GL_INVALID_OPERATION,
			"MapBufferRange was executed with access == GL_MAP_READ_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT",
			test_result);

		gl.mapBufferRange(GL_ARRAY_BUFFER, 0 /* offset */, data_size, GL_MAP_WRITE_BIT);
		verifyError(
			GL_INVALID_OPERATION,
			"MapBufferRange was executed with access == GL_MAP_WRITE_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT",
			test_result);

		gl.mapBufferRange(GL_ARRAY_BUFFER, 0 /* offset */, data_size, GL_MAP_PERSISTENT_BIT);
		verifyError(
			GL_INVALID_OPERATION,
			"MapBufferRange was executed with access == GL_MAP_PERSISTENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT",
			test_result);

		gl.mapBufferRange(GL_ARRAY_BUFFER, 0 /* offset */, data_size, GL_MAP_COHERENT_BIT);
		verifyError(
			GL_INVALID_OPERATION,
			"MapBufferRange was executed with access == GL_MAP_COHERENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT",
			test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVALID_OPERATION is generated by BufferSubData and NamedBufferSubData
	 * when buffer has immutable store but its flags does not include
	 * DYNAMIC_STORAGE.
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		buffer.InitStorage(GL_ARRAY_BUFFER, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT, data_size,
						   data);

		/* NamedBufferSubData */
		if (0 != gl.namedBufferSubData)
		{
			gl.namedBufferSubData(buffer.m_id, 0 /* offset */, data_size, data);
			verifyError(GL_INVALID_OPERATION,
						"NamedBufferSubData was executed for storage without GL_DYNAMIC_STORAGE_BIT", test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferSubData(GL_ARRAY_BUFFER, 0 /* offset */, data_size, data);
		verifyError(GL_INVALID_OPERATION, "BufferSubData was executed for storage without GL_DYNAMIC_STORAGE_BIT",
					test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}